

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall
cmTarget::StrictTargetComparison::operator()(StrictTargetComparison *this,cmTarget *t1,cmTarget *t2)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  cmMakefile *pcVar4;
  int nameResult;
  cmTarget *t2_local;
  cmTarget *t1_local;
  StrictTargetComparison *this_local;
  
  cmTarget::GetName_abi_cxx11_(t1);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cmTarget::GetName_abi_cxx11_(t2);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar1 = strcmp(pcVar2,pcVar3);
  if (iVar1 == 0) {
    pcVar4 = GetMakefile(t1);
    pcVar2 = cmMakefile::GetCurrentBinaryDirectory(pcVar4);
    pcVar4 = GetMakefile(t2);
    pcVar3 = cmMakefile::GetCurrentBinaryDirectory(pcVar4);
    iVar1 = strcmp(pcVar2,pcVar3);
  }
  this_local._7_1_ = iVar1 < 0;
  return this_local._7_1_;
}

Assistant:

bool cmTarget::StrictTargetComparison::operator()(cmTarget const* t1,
                                                  cmTarget const* t2) const
{
  int nameResult = strcmp(t1->GetName().c_str(), t2->GetName().c_str());
  if (nameResult == 0) {
    return strcmp(t1->GetMakefile()->GetCurrentBinaryDirectory(),
                  t2->GetMakefile()->GetCurrentBinaryDirectory()) < 0;
  }
  return nameResult < 0;
}